

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_ldxs(DisasContext_conflict6 *ctx,int base,int index,int rd)

{
  TCGContext_conflict6 *tcg_ctx;
  TCGv_i64 t;
  TCGv_i64 t_00;
  uintptr_t o;
  uintptr_t o_1;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  t = tcg_temp_new_i64(tcg_ctx);
  t_00 = tcg_temp_new_i64(tcg_ctx);
  gen_load_gpr(tcg_ctx,t,base);
  if (index != 0) {
    gen_load_gpr(tcg_ctx,t_00,index);
    tcg_gen_shli_i64_mips64el(tcg_ctx,t_00,t_00,2);
    gen_op_addr_add(ctx,t,t_00,t);
  }
  tcg_gen_qemu_ld_i64_mips64el(tcg_ctx,t_00,t,(long)ctx->mem_idx,MO_LESL);
  gen_store_gpr(tcg_ctx,t_00,rd);
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(t + (long)tcg_ctx));
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(t_00 + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_ldxs(DisasContext *ctx, int base, int index, int rd)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0 = tcg_temp_new(tcg_ctx);
    TCGv t1 = tcg_temp_new(tcg_ctx);

    gen_load_gpr(tcg_ctx, t0, base);

    if (index != 0) {
        gen_load_gpr(tcg_ctx, t1, index);
        tcg_gen_shli_tl(tcg_ctx, t1, t1, 2);
        gen_op_addr_add(ctx, t0, t1, t0);
    }

    tcg_gen_qemu_ld_tl(tcg_ctx, t1, t0, ctx->mem_idx, MO_TESL);
    gen_store_gpr(tcg_ctx, t1, rd);

    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
}